

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O0

Transform * __thiscall sf::Transform::combine(Transform *this,Transform *transform)

{
  Transform local_68;
  Transform *local_28;
  float *b;
  float *a;
  Transform *transform_local;
  Transform *this_local;
  
  local_28 = transform;
  b = this->m_matrix;
  a = transform->m_matrix;
  transform_local = this;
  Transform(&local_68,
            this->m_matrix[0xc] * transform->m_matrix[3] +
            this->m_matrix[0] * transform->m_matrix[0] + this->m_matrix[4] * transform->m_matrix[1],
            this->m_matrix[0xc] * transform->m_matrix[7] +
            this->m_matrix[0] * transform->m_matrix[4] + this->m_matrix[4] * transform->m_matrix[5],
            this->m_matrix[0xc] * transform->m_matrix[0xf] +
            this->m_matrix[0] * transform->m_matrix[0xc] +
            this->m_matrix[4] * transform->m_matrix[0xd],
            this->m_matrix[0xd] * transform->m_matrix[3] +
            this->m_matrix[1] * transform->m_matrix[0] + this->m_matrix[5] * transform->m_matrix[1],
            this->m_matrix[0xd] * transform->m_matrix[7] +
            this->m_matrix[1] * transform->m_matrix[4] + this->m_matrix[5] * transform->m_matrix[5],
            this->m_matrix[0xd] * transform->m_matrix[0xf] +
            this->m_matrix[1] * transform->m_matrix[0xc] +
            this->m_matrix[5] * transform->m_matrix[0xd],
            this->m_matrix[0xf] * transform->m_matrix[3] +
            this->m_matrix[3] * transform->m_matrix[0] + this->m_matrix[7] * transform->m_matrix[1],
            this->m_matrix[0xf] * transform->m_matrix[7] +
            this->m_matrix[3] * transform->m_matrix[4] + this->m_matrix[7] * transform->m_matrix[5],
            this->m_matrix[0xf] * transform->m_matrix[0xf] +
            this->m_matrix[3] * transform->m_matrix[0xc] +
            this->m_matrix[7] * transform->m_matrix[0xd]);
  memcpy(this,&local_68,0x40);
  return this;
}

Assistant:

Transform& Transform::combine(const Transform& transform)
{
    const float* a = m_matrix;
    const float* b = transform.m_matrix;

    *this = Transform(a[0] * b[0]  + a[4] * b[1]  + a[12] * b[3],
                      a[0] * b[4]  + a[4] * b[5]  + a[12] * b[7],
                      a[0] * b[12] + a[4] * b[13] + a[12] * b[15],
                      a[1] * b[0]  + a[5] * b[1]  + a[13] * b[3],
                      a[1] * b[4]  + a[5] * b[5]  + a[13] * b[7],
                      a[1] * b[12] + a[5] * b[13] + a[13] * b[15],
                      a[3] * b[0]  + a[7] * b[1]  + a[15] * b[3],
                      a[3] * b[4]  + a[7] * b[5]  + a[15] * b[7],
                      a[3] * b[12] + a[7] * b[13] + a[15] * b[15]);

    return *this;
}